

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket<std::span<char,18446744073709551615ul>>
          (coro_http_client *this,span<char,_18446744073709551615UL> source,opcode op)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  span<char,_18446744073709551615UL> *this_00;
  pointer in_RDX;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  char in_R8B;
  resp_data *value;
  LazyPromise<cinatra::resp_data> *in_stack_fffffffffffffc90;
  LazyPromise<cinatra::resp_data> *this_01;
  char *in_stack_fffffffffffffc98;
  LazyPromiseBase *this_02;
  websocket *in_stack_fffffffffffffca0;
  void *this_03;
  LazyPromise<cinatra::resp_data> *in_stack_fffffffffffffca8;
  void *pvVar3;
  size_t in_stack_fffffffffffffcb0;
  void *this_04;
  char *in_stack_fffffffffffffcb8;
  uint16_t in_stack_fffffffffffffcc6;
  websocket *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  int local_300;
  undefined8 local_198;
  undefined8 uStack_190;
  pointer local_178;
  undefined8 local_170;
  undefined1 in_stack_ffffffffffffff57;
  resp_data *in_stack_ffffffffffffff58;
  opcode in_stack_ffffffffffffff67;
  coro_http_client *in_stack_ffffffffffffff68;
  span<char,_18446744073709551615UL> in_stack_ffffffffffffff70;
  websocket *in_stack_ffffffffffffff90;
  
  puVar2 = (undefined8 *)operator_new(0x180,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = write_websocket<std::span<char,18446744073709551615ul>>;
    puVar2[1] = write_websocket<std::span<char,18446744073709551615ul>>;
    this_00 = (span<char,_18446744073709551615UL> *)(puVar2 + 0x26);
    puVar2[0x2e] = in_RSI;
    this_00->_M_ptr = in_RDX;
    puVar2[0x27] = in_RCX;
    *(char *)((long)puVar2 + 0x17d) = in_R8B;
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
              (in_stack_fffffffffffffc90);
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
              (in_stack_fffffffffffffca8);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0x17e));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0x17e));
      std::error_code::error_code((error_code *)in_stack_fffffffffffffc90);
      *(undefined4 *)(puVar2 + 0xf) = 0;
      *(undefined1 *)((long)puVar2 + 0x7c) = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)(puVar2 + 0x10));
      std::span<cinatra::http_header,_18446744073709551615UL>::span
                ((span<cinatra::http_header,_18446744073709551615UL> *)0x2cdc53);
      memset(puVar2 + 0x14,0,0x38);
      websocket::websocket(in_stack_fffffffffffffca0);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffca0);
      if (*(char *)((long)puVar2 + 0x17d) == '\b') {
        std::span<char,_18446744073709551615UL>::data(this_00);
        std::span<char,_18446744073709551615UL>::size
                  ((span<char,_18446744073709551615UL> *)0x2cdcb7);
        websocket::format_close_payload_abi_cxx11_
                  (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc6,in_stack_fffffffffffffcb8,
                   in_stack_fffffffffffffcb0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc90);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2cdd0d);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (puVar2 + 0x22));
        std::span<char,_18446744073709551615UL>::span<char_*>
                  ((span<char,_18446744073709551615UL> *)in_stack_fffffffffffffca0,
                   in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
        this_00->_M_ptr = local_178;
        puVar2[0x27] = local_170;
      }
      std::span<char,_18446744073709551615UL>::span((span<char,_18446744073709551615UL> *)0x2cdd9f);
      std::span<char,_18446744073709551615UL>::data(this_00);
      std::span<char,_18446744073709551615UL>::size((span<char,_18446744073709551615UL> *)0x2cddc1);
      std::span<char,_18446744073709551615UL>::span<char_*>
                ((span<char,_18446744073709551615UL> *)in_stack_fffffffffffffca0,
                 in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
      puVar2[0x28] = local_198;
      puVar2[0x29] = uStack_190;
      puVar2[0x21] = puVar2[0x1a];
      puVar2[0x1f] = puVar2[0x18];
      puVar2[0x20] = puVar2[0x19];
      puVar2[0x1d] = puVar2[0x16];
      puVar2[0x1e] = puVar2[0x17];
      puVar2[0x1b] = puVar2[0x14];
      puVar2[0x1c] = puVar2[0x15];
      value = (resp_data *)puVar2[0x1b];
      this_01 = (LazyPromise<cinatra::resp_data> *)puVar2[0x1c];
      this_02 = (LazyPromiseBase *)puVar2[0x1d];
      this_03 = (void *)puVar2[0x1e];
      pvVar3 = (void *)puVar2[0x1f];
      this_04 = (void *)puVar2[0x20];
      write_ws_frame(in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff67,in_stack_ffffffffffffff58,
                     (bool)in_stack_ffffffffffffff57);
      async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<void>>
                (this_02,(Lazy<void> *)this_01);
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<void>::await_ready
                        ((LazyAwaiterBase<void> *)(puVar2 + 0x2c));
      if (bVar1) {
        puVar2[0x2a] = (LazyAwaiterBase<void> *)(puVar2 + 0x2c);
        async_simple::coro::detail::LazyAwaiterBase<void>::awaitResume
                  ((LazyAwaiterBase<void> *)this_01);
        async_simple::coro::detail::LazyBase<void,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x2cdff7);
        async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x2ce004);
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>(this_01,value);
        local_300 = 3;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
        if (local_300 == 3) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0x17f));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0x17c) = 2;
            write_websocket(this_03,this_02);
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0x17f));
        }
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
                  ((LazyPromise<cinatra::resp_data> *)0x2ce1ea);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0x180);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0x17c) = 1;
        write_websocket(this_04,pvVar3);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0x17c) = 0;
      write_websocket(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    }
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket(
      Source source, opcode op = opcode::text) {
    resp_data data{};

    websocket ws{};
    std::string close_str;
    if (op == opcode::close) {
      if constexpr (is_span_v<Source>) {
        close_str = ws.format_close_payload(close_code::normal, source.data(),
                                            source.size());
        source = {close_str.data(), close_str.size()};
      }
    }

    std::span<char> span{};
    if constexpr (is_span_v<Source>) {
      span = {source.data(), source.size()};
#ifdef CINATRA_ENABLE_GZIP
      std::string dest_buf;
      if (enable_ws_deflate_) {
        gzip_compress({source.data(), source.size()}, dest_buf, span, data);
      }
#endif
      co_await write_ws_frame(span, ws, op, data, true);
    }
    else {
      while (true) {
        auto result = co_await source();
        span = {result.buf.data(), result.buf.size()};
#ifdef CINATRA_ENABLE_GZIP
        std::string dest_buf;
        if (enable_ws_deflate_) {
          gzip_compress({result.buf.data(), result.buf.size()}, dest_buf, span,
                        data);
        }
#endif
        co_await write_ws_frame(span, ws, op, data, result.eof);

        if (result.eof || data.status == 404) {
          break;
        }
      }
    }

    co_return data;
  }